

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

void __thiscall
Js::ObjectVariablesWalker::AddObjectProperties
          (ObjectVariablesWalker *this,int count,RecyclableObject *object)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  JavascriptLibrary *pJVar4;
  undefined4 extraout_var_00;
  undefined4 *puVar5;
  DebuggerPropertyDisplayInfo *local_50;
  DebuggerPropertyDisplayInfo *info;
  Var itemObj;
  uint local_38;
  bool isInDeadZone;
  bool isPropertyInDebuggerScope;
  int iStack_34;
  bool isConst;
  PropertyId propertyId;
  int i;
  DebuggerScope *formalScope;
  ScriptContext *scriptContext;
  RecyclableObject *object_local;
  ObjectVariablesWalker *pOStack_10;
  int count_local;
  ObjectVariablesWalker *this_local;
  
  scriptContext = (ScriptContext *)object;
  object_local._4_4_ = count;
  pOStack_10 = this;
  iVar3 = (*((this->super_VariableWalkerBase).pFrame)->_vptr_DiagStackFrame[10])();
  formalScope = (DebuggerScope *)CONCAT44(extraout_var,iVar3);
  _propertyId = LocalsWalker::GetScopeWhenHaltAtFormals((this->super_VariableWalkerBase).pFrame);
  iStack_34 = 0;
  do {
    if (object_local._4_4_ <= iStack_34) {
      return;
    }
    local_38 = (*(scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo[7])
                         (scriptContext,(ulong)(ushort)iStack_34);
    itemObj._7_1_ = 0;
    itemObj._6_1_ = 0;
    itemObj._5_1_ = 0;
    if (((local_38 != 0xffffffff) &&
        (bVar2 = VariableWalkerBase::IsPropertyValid
                           (&this->super_VariableWalkerBase,local_38,0xffffffff,
                            (bool *)((long)&itemObj + 6),(bool *)((long)&itemObj + 7),
                            (bool *)((long)&itemObj + 5)), bVar2)) &&
       (iVar3 = (*(scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x32])
                          (scriptContext,(ulong)local_38), iVar3 != 0)) {
      info = (DebuggerPropertyDisplayInfo *)
             RecyclableObjectWalker::GetObject
                       ((RecyclableObject *)scriptContext,(RecyclableObject *)scriptContext,local_38
                        ,(ScriptContext *)formalScope);
      if (info == (DebuggerPropertyDisplayInfo *)0x0) {
        pJVar4 = ScriptContext::GetLibrary((ScriptContext *)formalScope);
        info = (DebuggerPropertyDisplayInfo *)
               JavascriptLibraryBase::GetUndefined(&pJVar4->super_JavascriptLibraryBase);
      }
      bVar2 = VariableWalkerBase::IsInParamScope
                        (_propertyId,(this->super_VariableWalkerBase).pFrame);
      if (bVar2) {
        iVar3 = (*((this->super_VariableWalkerBase).pFrame)->_vptr_DiagStackFrame[10])();
        bVar2 = ScriptContext::IsUndeclBlockVar
                          ((ScriptContext *)CONCAT44(extraout_var_00,iVar3),info);
        if (bVar2) {
          pJVar4 = ScriptContext::GetLibrary((ScriptContext *)formalScope);
          info = (DebuggerPropertyDisplayInfo *)
                 JavascriptLibraryBase::GetUndefined(&pJVar4->super_JavascriptLibraryBase);
        }
      }
      bVar2 = VarIs<Js::RootObjectBase,Js::RecyclableObject>((RecyclableObject *)scriptContext);
      if ((bVar2) && ((itemObj._7_1_ & 1) != 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                    ,0x360,"(!VarIs<RootObjectBase>(object) || !isConst)",
                                    "root object shouldn\'t produce const properties through IsPropertyValid"
                                   );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      local_50 = VariableWalkerBase::AllocateNewPropertyDisplayInfo
                           (&this->super_VariableWalkerBase,local_38,info,(bool)(itemObj._7_1_ & 1),
                            (bool)(itemObj._5_1_ & 1));
      if (local_50 == (DebuggerPropertyDisplayInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                    ,0x368,"(info)","info");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      JsUtil::
      List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
      ::Add((this->super_VariableWalkerBase).pMembersList,&local_50);
    }
    iStack_34 = iStack_34 + 1;
  } while( true );
}

Assistant:

void ObjectVariablesWalker::AddObjectProperties(int count, Js::RecyclableObject* object)
    {
        ScriptContext * scriptContext = pFrame->GetScriptContext();

        DebuggerScope *formalScope = LocalsWalker::GetScopeWhenHaltAtFormals(pFrame);

        // For the scopes and locals only enumerable properties will be shown.
        for (int i = 0; i < count; i++)
        {
            Js::PropertyId propertyId = object->GetPropertyId((PropertyIndex)i);

            bool isConst = false;
            bool isPropertyInDebuggerScope = false;
            bool isInDeadZone = false;
            if (propertyId != Js::Constants::NoProperty
                && IsPropertyValid(propertyId, Js::Constants::NoRegister, &isPropertyInDebuggerScope, &isConst, &isInDeadZone)
                && object->IsEnumerable(propertyId))
            {
                Var itemObj = RecyclableObjectWalker::GetObject(object, object, propertyId, scriptContext);
                if (itemObj == nullptr)
                {
                    itemObj = scriptContext->GetLibrary()->GetUndefined();
                }

                if (IsInParamScope(formalScope, pFrame) && pFrame->GetScriptContext()->IsUndeclBlockVar(itemObj))
                {
                    itemObj = scriptContext->GetLibrary()->GetUndefined();
                }

                AssertMsg(!VarIs<RootObjectBase>(object) || !isConst, "root object shouldn't produce const properties through IsPropertyValid");

                DebuggerPropertyDisplayInfo *info = AllocateNewPropertyDisplayInfo(
                    propertyId,
                    itemObj,
                    isConst,
                    isInDeadZone);

                Assert(info);
                pMembersList->Add(info);
            }
        }
    }